

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

CookieInfo * Curl_cookie_init(SessionHandle *data,char *file,CookieInfo *inc,_Bool newsession)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  FILE *local_78;
  char *local_70;
  char *line;
  char *pcStack_50;
  _Bool headerline;
  char *lineptr;
  FILE *pFStack_40;
  _Bool fromfile;
  FILE *fp;
  CookieInfo *c;
  _Bool newsession_local;
  CookieInfo *inc_local;
  char *file_local;
  SessionHandle *data_local;
  
  bVar1 = true;
  fp = (FILE *)inc;
  if (inc == (CookieInfo *)0x0) {
    fp = (FILE *)(*Curl_ccalloc)(1,0x28);
    if (fp == (FILE *)0x0) {
      return (CookieInfo *)0x0;
    }
    local_70 = file;
    if (file == (char *)0x0) {
      local_70 = "none";
    }
    pcVar3 = (*Curl_cstrdup)(local_70);
    fp->_IO_read_ptr = pcVar3;
  }
  *(undefined1 *)&fp->_IO_read_end = 0;
  if ((file == (char *)0x0) || (iVar2 = curl_strequal(file,"-"), iVar2 == 0)) {
    if ((file == (char *)0x0) || (*file != '\0')) {
      if (file == (char *)0x0) {
        local_78 = (FILE *)0x0;
      }
      else {
        local_78 = fopen64(file,"r");
      }
      pFStack_40 = local_78;
    }
    else {
      pFStack_40 = (FILE *)0x0;
    }
  }
  else {
    pFStack_40 = _stdin;
    bVar1 = false;
  }
  *(_Bool *)&fp->_IO_write_base = newsession;
  if (pFStack_40 != (FILE *)0x0) {
    pcVar3 = (char *)(*Curl_cmalloc)(5000);
    if (pcVar3 != (char *)0x0) {
      while (pcVar4 = fgets(pcVar3,5000,pFStack_40), pcVar4 != (char *)0x0) {
        iVar2 = Curl_raw_nequal("Set-Cookie:",pcVar3,0xb);
        pcStack_50 = pcVar3;
        if (iVar2 != 0) {
          pcStack_50 = pcVar3 + 0xb;
        }
        while( true ) {
          bVar5 = false;
          if ((*pcStack_50 != '\0') && (bVar5 = true, *pcStack_50 != ' ')) {
            bVar5 = *pcStack_50 == '\t';
          }
          if (!bVar5) break;
          pcStack_50 = pcStack_50 + 1;
        }
        Curl_cookie_add(data,(CookieInfo *)fp,iVar2 != 0,pcStack_50,(char *)0x0,(char *)0x0);
      }
      (*Curl_cfree)(pcVar3);
    }
    if (bVar1) {
      fclose(pFStack_40);
    }
  }
  *(undefined1 *)&fp->_IO_read_end = 1;
  return (CookieInfo *)fp;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct SessionHandle *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *fp;
  bool fromfile=TRUE;

  if(NULL == inc) {
    /* we didn't get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    c->filename = strdup(file?file:"none"); /* copy the name just in case */
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->running = FALSE; /* this is not running, this is init */

  if(file && strequal(file, "-")) {
    fp = stdin;
    fromfile=FALSE;
  }
  else if(file && !*file) {
    /* points to a "" string */
    fp = NULL;
  }
  else
    fp = file?fopen(file, "r"):NULL;

  c->newsession = newsession; /* new session? */

  if(fp) {
    char *lineptr;
    bool headerline;

    char *line = malloc(MAX_COOKIE_LINE);
    if(line) {
      while(fgets(line, MAX_COOKIE_LINE, fp)) {
        if(checkprefix("Set-Cookie:", line)) {
          /* This is a cookie line, get it! */
          lineptr=&line[11];
          headerline=TRUE;
        }
        else {
          lineptr=line;
          headerline=FALSE;
        }
        while(*lineptr && ISBLANK(*lineptr))
          lineptr++;

        Curl_cookie_add(data, c, headerline, lineptr, NULL, NULL);
      }
      free(line); /* free the line buffer */
    }
    if(fromfile)
      fclose(fp);
  }

  c->running = TRUE;          /* now, we're running */

  return c;
}